

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_dictionary.hpp
# Opt level: O1

bool pd::readPhrases(string *dir_name,
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *data)

{
  uint uVar1;
  pointer pcVar2;
  undefined8 uVar3;
  char cVar4;
  int iVar5;
  error_code *peVar6;
  ostream *poVar7;
  istream *piVar8;
  bool bVar9;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_2f8;
  ifstream fi;
  dir_itr_imp local_2e8 [16];
  uint auStack_2d8 [122];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  size_type *local_d0;
  path targetDir;
  undefined1 local_a8 [8];
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  concr_phrase;
  directory_iterator local_60;
  directory_iterator it;
  directory_iterator eod;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_48;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_40;
  directory_iterator local_38;
  
  local_d0 = &targetDir.m_pathname._M_string_length;
  pcVar2 = (dir_name->_M_dataplus)._M_p;
  targetDir.m_pathname.field_2._8_8_ = data;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar2,pcVar2 + dir_name->_M_string_length);
  boost::filesystem::directory_iterator::directory_iterator(&local_60,(path *)&local_d0,none);
  it.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  local_2f8 = local_60.m_imp.px;
  if (local_60.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_60.m_imp.px = *(int *)local_60.m_imp.px + 1;
    UNLOCK();
  }
  _fi = 0;
  eod.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)
                 (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_60;
  if (local_60.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_60.m_imp.px = *(int *)local_60.m_imp.px + 1;
    UNLOCK();
  }
  local_48.px = (dir_itr_imp *)0x0;
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)&fi);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_2f8);
  local_2f8 = eod.m_imp.px;
  if (eod.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)eod.m_imp.px = *(int *)eod.m_imp.px + 1;
    UNLOCK();
  }
  local_38 = (directory_iterator)(directory_iterator)eod.m_imp.px;
  if (eod.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)eod.m_imp.px = *(int *)eod.m_imp.px + 1;
    UNLOCK();
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_2f8);
  local_2f8.px = local_48.px;
  if (local_48.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_48.px = *(int *)local_48.px + 1;
    UNLOCK();
  }
  local_40.px = local_48.px;
  if (local_48.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_48.px = *(int *)local_48.px + 1;
    UNLOCK();
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_2f8);
  do {
    if ((local_38.m_imp.px == (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_40.px) ||
       (((local_38.m_imp.px == (dir_itr_imp *)0x0 ||
         (*(long *)((long)local_38.m_imp.px + 0x38) == 0)) &&
        ((local_40.px == (dir_itr_imp *)0x0 || (*(long *)(local_40.px + 0x38) == 0)))))) {
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_40);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_38.m_imp);
      bVar9 = true;
LAB_0010f669:
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_48);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&eod.m_imp);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&it.m_imp);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_60.m_imp);
      if (local_d0 != &targetDir.m_pathname._M_string_length) {
        operator_delete(local_d0);
      }
      return bVar9;
    }
    peVar6 = (error_code *)boost::filesystem::directory_iterator::dereference(&local_38);
    boost::filesystem::detail::status((path *)&local_2f8,peVar6);
    if ((int)local_2f8.px == 2) {
      boost::filesystem::path::extension();
      iVar5 = boost::filesystem::path::compare((path *)&local_2f8,"swp");
      if (local_2f8.px != local_2e8) {
        operator_delete(local_2f8.px);
      }
      if (iVar5 != 0) {
        std::ifstream::ifstream((istream *)&local_2f8,(string *)peVar6,_S_in);
        uVar1 = *(uint *)((long)auStack_2d8 + *(long *)(local_2f8.px + -0x18));
        if ((uVar1 & 5) == 0) {
          line._M_dataplus._M_p = (pointer)0x0;
          line._M_string_length._0_1_ = 0;
          line.field_2._8_8_ = 0;
          local_a8 = (undefined1  [8])&line._M_string_length;
          while( true ) {
            cVar4 = std::ios::widen((char)*(undefined8 *)(local_2f8.px + -0x18) +
                                    (char)(istream *)&local_2f8);
            piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)&local_2f8,(string *)local_a8,cVar4);
            if ((((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) ||
               (line._M_dataplus._M_p == (pointer)0x0)) break;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&line.field_2 + 8),(value_type *)local_a8);
          }
          boost::filesystem::path::filename();
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)targetDir.m_pathname.field_2._8_8_,local_f0,
                     (undefined1 *)((long)&line.field_2 + 8));
          uVar3 = line.field_2._8_8_;
          if (local_f0[0] != local_e0) {
            operator_delete(local_f0[0]);
            uVar3 = line.field_2._8_8_;
          }
          for (; (undefined8 *)uVar3 != (undefined8 *)0x0; uVar3 = (undefined8 *)(uVar3 + 0x20)) {
            if (*(undefined8 **)uVar3 != (undefined8 *)(uVar3 + 0x10)) {
              operator_delete(*(undefined8 **)uVar3);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&line.field_2 + 8));
          if (local_a8 != (undefined1  [8])&line._M_string_length) {
            operator_delete((void *)local_a8);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,*(char **)peVar6,(long)peVar6->cat_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"doesn\'t exist",0xd);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
        }
        std::ifstream::~ifstream((istream *)&local_2f8);
        if ((uVar1 & 5) != 0) {
          boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_40);
          boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                    (&local_38.m_imp);
          bVar9 = false;
          goto LAB_0010f669;
        }
      }
    }
    boost::filesystem::detail::directory_iterator_increment(&local_38,(error_code *)0x0);
  } while( true );
}

Assistant:

bool readPhrases(const std::string& dir_name, std::unordered_map<std::string, std::vector<std::string>>& data)
    {        
        fs::path targetDir(dir_name); 
        fs::directory_iterator it(targetDir), eod;

        BOOST_FOREACH(const fs::path &p, std::make_pair(it, eod))   
        { 
            if(is_regular_file(p))
            {
                if (p.extension() == "swp")
                    continue;
                std::ifstream fi(p.string());
                if (not fi)
                {
                    std::cerr << "File " << p.string() << "doesn't exist" << std::endl;
                    return false;
                }

                std::string line;
                std::vector<std::string> concr_phrase;
                while (std::getline(fi, line) and !line.empty())
                {
                    //line.erase(line.find_last_not_of(" \n\r\t")+1);
                    concr_phrase.push_back(line);
                }
                data.emplace(p.filename().string(), concr_phrase);
                concr_phrase.clear();
            } 
        }
        return true;
    }